

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>::__decodeArray
          (SIMDSimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t *length,
          uint32_t *out,size_t nvalue)

{
  uint32_t *out_00;
  reference puVar1;
  long in_RCX;
  byte *pbVar2;
  long *in_RDX;
  uint *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  ulong in_R8;
  size_t *in_stack_00000020;
  uint32_t *in_stack_00000028;
  size_t in_stack_00000030;
  uint8_t pos;
  uint32_t *in_stack_00000038;
  uint32_t k;
  uint8_t cexcept;
  uint8_t b;
  Simple8b<true> *in_stack_00000040;
  uint32_t run;
  iterator exceptionsptr;
  size_t le;
  size_t cap;
  uint8_t *bytep;
  uint32_t bytesize;
  uint32_t *inexcept;
  uint32_t wheremeta;
  uint32_t *headerin;
  uint32_t *initin;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  pointer *this_00;
  uint32_t *puVar4;
  size_type in_stack_ffffffffffffff68;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  byte local_7d;
  uint local_7c;
  byte local_76;
  byte local_75;
  uint local_74;
  uint *local_70;
  uint32_t *local_68;
  size_type local_60;
  uint *local_58;
  uint local_4c;
  uint32_t *local_48;
  uint local_3c;
  uint *local_30;
  ulong local_28;
  long local_20;
  long *local_18;
  uint *local_10;
  
  local_10 = in_RSI + 1;
  local_3c = *in_RSI;
  local_58 = in_RSI + local_3c + 1;
  local_4c = in_RSI[local_3c];
  local_48 = (uint32_t *)(((ulong)local_4c + 3 & 0xfffffffffffffffc) + (long)local_58);
  pvVar3 = in_RDI + 1;
  local_30 = in_RSI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::capacity(in_RDI + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(in_RDI,in_stack_ffffffffffffff68)
  ;
  local_60 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI + 1);
  out_00 = (uint32_t *)((long)local_30 + (*local_18 * 4 - (long)local_48) >> 2);
  this_00 = &(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  puVar4 = local_48;
  local_68 = out_00;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI + 1,0);
  local_48 = Simple8b<true>::decodeArray
                       (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                        in_stack_00000020);
  *local_18 = (long)local_48 - (long)local_30 >> 2;
  local_70 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (in_stack_ffffffffffffff48);
  for (local_74 = 0; (ulong)local_74 < local_28 >> 7; local_74 = local_74 + 1) {
    pbVar2 = (byte *)((long)local_58 + 1);
    local_75 = (byte)*local_58;
    local_58 = (uint *)((long)local_58 + 2);
    local_76 = *pbVar2;
    usimdunpack((__m128i *)in_RDI,out_00,(uint32_t)((ulong)puVar4 >> 0x20));
    local_10 = local_10 + (int)((uint)local_75 << 2);
    for (local_7c = 0; local_7c < local_76; local_7c = local_7c + 1) {
      local_7d = (byte)*local_58;
      local_58 = (uint *)((long)local_58 + 1);
      local_88 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)this_00,(int)((ulong)pvVar3 >> 0x20));
      puVar1 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_88);
      *(uint *)(local_20 + (ulong)local_7d * 4) =
           *puVar1 << (local_75 & 0x1f) | *(uint *)(local_20 + (ulong)local_7d * 4);
    }
    local_20 = local_20 + 0x200;
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, uint32_t *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    datatobepacked.resize(datatobepacked.capacity());
    size_t cap = datatobepacked.size();
    size_t le = initin + length - inexcept;
    inexcept = ecoder.decodeArray(inexcept, le, &datatobepacked[0], cap);

    length = inexcept - initin;

    auto exceptionsptr = datatobepacked.begin();
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      // in = unpackblock<BlockSize>(in, out, b);
      assert(BlockSize == 128);
      usimdunpack(reinterpret_cast<const __m128i *>(in), out, b);
      in += BlockSizeInUnitsOfPackSize * b;
      for (uint32_t k = 0; k < cexcept; ++k) {
        const uint8_t pos = *(bytep++);
        out[pos] |= (*(exceptionsptr++)) << b;
      }
    }
    assert(in == headerin + wheremeta);
  }